

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QRegion __thiscall QListView::visualRegionForSelection(QListView *this,QItemSelection *selection)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QListViewPrivate *this_00;
  QItemSelectionRange *this_01;
  ulong uVar6;
  long *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QRect *rect;
  int r;
  int b;
  int t;
  QItemSelectionRange *elem;
  QItemSelection *__range1;
  QRect *viewportRect;
  int c;
  QListViewPrivate *d;
  QRegion *selectionRegion;
  QRect rect_1;
  QModelIndex bottom;
  QModelIndex top;
  QModelIndex parent;
  const_iterator __end1;
  const_iterator __begin1;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  QModelIndex *abottomRight;
  QWidget *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *local_40;
  QWidgetData *local_38;
  QItemSelectionRange *local_30;
  const_iterator local_28;
  const_iterator local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  abottomRight = in_RDI;
  this_00 = d_func((QListView *)0x87e5a7);
  iVar1 = this_00->column;
  *(undefined1 **)abottomRight = &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)abottomRight);
  local_18 = QWidget::rect(in_stack_fffffffffffffec8);
  local_20.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QList<QItemSelectionRange>::begin((QList<QItemSelectionRange> *)in_RDI);
  local_28.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)in_RDI);
  do {
    local_30 = local_28.i;
    bVar3 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_20,local_28);
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (QRegion)(QRegionData *)in_RDI;
      }
      __stack_chk_fail();
    }
    this_01 = QList<QItemSelectionRange>::const_iterator::operator*(&local_20);
    bVar3 = QItemSelectionRange::isValid((QItemSelectionRange *)in_stack_fffffffffffffec8);
    if (bVar3) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelectionRange::topLeft(this_01);
      QPersistentModelIndex::parent();
      bVar3 = ::operator!=(in_RDI,(QPersistentModelIndex *)
                                  CONCAT17(in_stack_fffffffffffffeaf,
                                           CONCAT16(in_stack_fffffffffffffeae,
                                                    in_stack_fffffffffffffea8)));
      if (!bVar3) {
        QItemSelectionRange::topLeft(this_01);
        iVar4 = QPersistentModelIndex::row();
        QItemSelectionRange::bottomRight(this_01);
        iVar5 = QPersistentModelIndex::row();
        if (this_00->viewMode != IconMode) {
          bVar3 = QListViewPrivate::isWrapping(this_00);
          if (!bVar3) {
            while( true ) {
              bVar3 = false;
              if (iVar4 <= iVar5) {
                bVar3 = QListViewPrivate::isHidden
                                  ((QListViewPrivate *)CONCAT44(iVar4,iVar5),
                                   in_stack_fffffffffffffed4);
              }
              if (bVar3 == false) break;
              iVar4 = iVar4 + 1;
            }
            in_stack_fffffffffffffeaf = 0;
            while( true ) {
              in_stack_fffffffffffffeae = false;
              if (iVar4 <= iVar5) {
                in_stack_fffffffffffffeae =
                     QListViewPrivate::isHidden
                               ((QListViewPrivate *)CONCAT44(iVar4,iVar5),in_stack_fffffffffffffed4)
                ;
              }
              if ((bool)in_stack_fffffffffffffeae == false) break;
              iVar5 = iVar5 + -1;
            }
            local_88 = &DAT_aaaaaaaaaaaaaaaa;
            local_80 = &DAT_aaaaaaaaaaaaaaaa;
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
            (**(code **)(*(long *)pQVar2 + 0x60))(&local_88,pQVar2,iVar4,iVar1,&local_48);
            local_a0 = &DAT_aaaaaaaaaaaaaaaa;
            local_98 = &DAT_aaaaaaaaaaaaaaaa;
            local_90 = &DAT_aaaaaaaaaaaaaaaa;
            pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
            (**(code **)(*(long *)pQVar2 + 0x60))(&local_a0,pQVar2,iVar5,iVar1,&local_48);
            local_b0 = &DAT_aaaaaaaaaaaaaaaa;
            local_a8 = &DAT_aaaaaaaaaaaaaaaa;
            (**(code **)(*in_RSI + 0x1e0))(in_RSI,&local_88);
            QRect::topLeft((QRect *)CONCAT17(in_stack_fffffffffffffeaf,
                                             CONCAT16(in_stack_fffffffffffffeae,
                                                      in_stack_fffffffffffffea8)));
            (**(code **)(*in_RSI + 0x1e0))(in_RSI,&local_a0);
            QRect::bottomRight((QRect *)CONCAT17(in_stack_fffffffffffffeaf,
                                                 CONCAT16(in_stack_fffffffffffffeae,
                                                          in_stack_fffffffffffffea8)));
            QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (QPoint *)in_stack_fffffffffffffec8,(QPoint *)abottomRight);
            uVar6 = QRect::intersects((QRect *)&local_18);
            if ((uVar6 & 1) != 0) {
              QRegion::operator+=((QRegion *)abottomRight,(QRect *)&local_b0);
            }
            goto LAB_0087ea40;
          }
        }
        for (; in_stack_fffffffffffffed4 = iVar4, iVar4 <= iVar5; iVar4 = iVar4 + 1) {
          pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar2 + 0x60))(local_70,pQVar2,iVar4,iVar1,&local_48);
          auVar7 = (**(code **)(*in_RSI + 0x1e0))(in_RSI,local_70);
          in_stack_fffffffffffffec8 = (QWidget *)local_58;
          local_58 = auVar7;
          uVar6 = QRect::intersects((QRect *)&local_18);
          if ((uVar6 & 1) != 0) {
            QRegion::operator+=((QRegion *)abottomRight,(QRect *)in_stack_fffffffffffffec8);
          }
        }
      }
    }
LAB_0087ea40:
    QList<QItemSelectionRange>::const_iterator::operator++(&local_20);
  } while( true );
}

Assistant:

QRegion QListView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QListView);
    // ### NOTE: this is a potential bottleneck in non-static mode
    int c = d->column;
    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    for (const auto &elem : selection) {
        if (!elem.isValid())
            continue;
        QModelIndex parent = elem.topLeft().parent();
        //we only display the children of the root in a listview
        //we're not interested in the other model indexes
        if (parent != d->root)
            continue;
        int t = elem.topLeft().row();
        int b = elem.bottomRight().row();
        if (d->viewMode == IconMode || d->isWrapping()) { // in non-static mode, we have to go through all selected items
            for (int r = t; r <= b; ++r) {
                const QRect &rect = visualRect(d->model->index(r, c, parent));
                if (viewportRect.intersects(rect))
                    selectionRegion += rect;
            }
        } else { // in static mode, we can optimize a bit
            while (t <= b && d->isHidden(t)) ++t;
            while (b >= t && d->isHidden(b)) --b;
            const QModelIndex top = d->model->index(t, c, parent);
            const QModelIndex bottom = d->model->index(b, c, parent);
            QRect rect(visualRect(top).topLeft(),
                       visualRect(bottom).bottomRight());
            if (viewportRect.intersects(rect))
                selectionRegion += rect;
        }
    }

    return selectionRegion;
}